

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

void czh::utils::grisu_round
               (string *buffer,uint64_t delta,uint64_t rest,uint64_t ten_kappa,uint64_t wp_w)

{
  bool bVar1;
  reference pvVar2;
  uint64_t wp_w_local;
  uint64_t ten_kappa_local;
  uint64_t rest_local;
  uint64_t delta_local;
  string *buffer_local;
  
  ten_kappa_local = rest;
  while( true ) {
    bVar1 = false;
    if (((ten_kappa_local < wp_w) && (bVar1 = false, ten_kappa <= delta - ten_kappa_local)) &&
       (bVar1 = true, wp_w <= ten_kappa_local + ten_kappa)) {
      bVar1 = (ten_kappa_local + ten_kappa) - wp_w < wp_w - ten_kappa_local;
    }
    if (!bVar1) break;
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (buffer);
    *pvVar2 = *pvVar2 + -1;
    ten_kappa_local = ten_kappa + ten_kappa_local;
  }
  return;
}

Assistant:

void grisu_round(std::string &buffer, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t wp_w)
  {
    while (rest < wp_w &&
           delta - rest >= ten_kappa &&
           (rest + ten_kappa < wp_w || /// closer
            wp_w - rest > rest + ten_kappa - wp_w))
    {
      --buffer.back();
      rest += ten_kappa;
    }
  }